

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool wallet::LoadEncryptionKey
               (CWallet *pwallet,DataStream *ssKey,DataStream *ssValue,string *strErr)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  mapped_type *this;
  string *__nbytes;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  bool bVar5;
  CMasterKey kMasterKey;
  uint nID;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  CMasterKey local_c0;
  _Rb_tree_color local_6c;
  unique_lock<std::recursive_mutex> local_68;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_device = &(pwallet->cs_wallet).super_recursive_mutex;
  local_68._M_owns = false;
  __nbytes = strErr;
  std::unique_lock<std::recursive_mutex>::lock(&local_68);
  DataStream::read(ssKey,(int)&local_c0,(void *)0x4,(size_t)__nbytes);
  local_6c = (_Rb_tree_color)
             local_c0.vchCryptedKey.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  CMasterKey::CMasterKey(&local_c0);
  UnserializeMany<DataStream,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,unsigned_int&,unsigned_int&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (ssValue,&local_c0.vchCryptedKey,&local_c0.vchSalt,&local_c0.nDerivationMethod,
             &local_c0.nDeriveIterations,&local_c0.vchOtherDerivationParameters);
  p_Var1 = &(pwallet->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (pwallet->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[bVar5]) {
    bVar5 = p_Var4[1]._M_color < local_6c;
    if (!bVar5) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, local_6c < p_Var3[1]._M_color)) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    this = std::
           map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
           ::operator[](&pwallet->mapMasterKeys,&local_6c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->vchCryptedKey,&local_c0.vchCryptedKey);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->vchSalt,&local_c0.vchSalt);
    this->nDerivationMethod = local_c0.nDerivationMethod;
    this->nDeriveIterations = local_c0.nDeriveIterations;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->vchOtherDerivationParameters,&local_c0.vchOtherDerivationParameters);
    if (pwallet->nMasterKeyMaxID < local_6c) {
      pwallet->nMasterKeyMaxID = local_6c;
    }
  }
  else {
    tinyformat::format<unsigned_int>
              (&local_58,"Error reading wallet database: duplicate CMasterKey id %u",&local_6c);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (strErr,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_c0.vchOtherDerivationParameters.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.vchOtherDerivationParameters.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.vchOtherDerivationParameters.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.vchOtherDerivationParameters.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.vchSalt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.vchSalt.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.vchSalt.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.vchSalt.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT44(local_c0.vchCryptedKey.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (_Rb_tree_color)
                            local_c0.vchCryptedKey.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_c0.vchCryptedKey.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (_Rb_tree_header *)p_Var4 == p_Var1;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadEncryptionKey(CWallet* pwallet, DataStream& ssKey, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        // Master encryption key is loaded into only the wallet and not any of the ScriptPubKeyMans.
        unsigned int nID;
        ssKey >> nID;
        CMasterKey kMasterKey;
        ssValue >> kMasterKey;
        if(pwallet->mapMasterKeys.count(nID) != 0)
        {
            strErr = strprintf("Error reading wallet database: duplicate CMasterKey id %u", nID);
            return false;
        }
        pwallet->mapMasterKeys[nID] = kMasterKey;
        if (pwallet->nMasterKeyMaxID < nID)
            pwallet->nMasterKeyMaxID = nID;

    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}